

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> * __thiscall
tinyusdz::GPrim::get_displayColors
          (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
           *__return_storage_ptr__,GPrim *this,double time,TimeSampleInterpolationType interp)

{
  bool bVar1;
  allocator local_3b1;
  string local_3b0;
  undefined1 local_390 [8];
  GeomPrimvar primvar;
  string local_68;
  undefined1 local_48 [8];
  string err;
  TimeSampleInterpolationType interp_local;
  double time_local;
  GPrim *this_local;
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *dst;
  
  err.field_2._M_local_buf[0xb] = '\0';
  err.field_2._12_4_ = interp;
  std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::vector
            (__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_68,"displayColor",
             (allocator *)((long)&primvar._interpolation.contained + 3));
  bVar1 = has_primvar(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)((long)&primvar._interpolation.contained + 3))
  ;
  if (bVar1) {
    GeomPrimvar::GeomPrimvar((GeomPrimvar *)local_390);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3b0,"displayColor",&local_3b1);
    bVar1 = get_primvar(this,&local_3b0,(GeomPrimvar *)local_390,(string *)local_48);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
    bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
    if (bVar1) {
      err.field_2._M_local_buf[0xb] = '\x01';
    }
    else {
      GeomPrimvar::flatten_with_indices<tinyusdz::value::color3f>
                ((GeomPrimvar *)local_390,time,__return_storage_ptr__,err.field_2._12_4_,
                 (string *)0x0);
    }
    GeomPrimvar::~GeomPrimvar((GeomPrimvar *)local_390);
    if (bVar1) goto LAB_0023b67a;
  }
  err.field_2._M_local_buf[0xb] = '\x01';
LAB_0023b67a:
  std::__cxx11::string::~string((string *)local_48);
  if ((err.field_2._M_local_buf[0xb] & 1U) == 0) {
    std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::~vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<value::color3f> GPrim::get_displayColors(
    double time, value::TimeSampleInterpolationType interp) const {
  std::vector<value::color3f> dst;

  std::string err;
  if (has_primvar("displayColor")) {
    GeomPrimvar primvar;
    if (!get_primvar("displayColor", &primvar, &err)) {
      return dst;
    }

    primvar.flatten_with_indices(time, &dst, interp);
  }

  return dst;
}